

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

int QUtf8::compareUtf8(QByteArrayView utf8,QLatin1StringView s,CaseSensitivity cs)

{
  uchar *puVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  byte *pbVar4;
  int in_R8D;
  long in_FS_OFFSET;
  char32_t uc2;
  qsizetype res;
  uchar b;
  uchar *end2;
  uchar *src2;
  uchar *end1;
  char32_t *output;
  uchar *src1;
  char32_t uc1;
  byte *end;
  undefined4 in_stack_ffffffffffffff88;
  char32_t in_stack_ffffffffffffff8c;
  char32_t **in_stack_ffffffffffffff90;
  byte *local_58;
  int local_44;
  uchar *local_38;
  char32_t local_2c;
  QLatin1String local_28;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = L'\0';
  puVar1 = (uchar *)QByteArrayView::data(&local_18);
  qVar2 = QByteArrayView::size(&local_18);
  local_58 = (byte *)QLatin1String::latin1(&local_28);
  end = local_58;
  qVar3 = QLatin1String::size(&local_28);
  pbVar4 = end + qVar3;
  local_38 = puVar1;
  do {
    if (puVar1 + qVar2 <= local_38 || pbVar4 <= local_58) {
      local_44 = (uint)(local_38 < puVar1 + qVar2) - (uint)(local_58 < pbVar4);
      goto LAB_00542381;
    }
    in_stack_ffffffffffffff90 =
         (char32_t **)
         QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                   (*local_38,in_stack_ffffffffffffff90,
                    (uchar **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),end);
    if ((long)in_stack_ffffffffffffff90 < 0) {
      local_2c = L'�';
    }
    in_stack_ffffffffffffff8c = (char32_t)*local_58;
    if (in_R8D == 0) {
      local_2c = QChar::toCaseFolded(L'\x00542328');
      in_stack_ffffffffffffff8c = QChar::toCaseFolded(L'\x00542335');
    }
    local_58 = local_58 + 1;
    local_38 = local_38 + 1;
  } while (local_2c == in_stack_ffffffffffffff8c);
  local_44 = local_2c - in_stack_ffffffffffffff8c;
LAB_00542381:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QLatin1StringView s, Qt::CaseSensitivity cs)
{
    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const uchar *>(s.latin1());
    auto end2 = src2 + s.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        char32_t uc2 = *src2++;
        if (cs == Qt::CaseInsensitive) {
            uc1 = QChar::toCaseFolded(uc1);
            uc2 = QChar::toCaseFolded(uc2);
        }
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}